

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initsout.c
# Opt level: O3

void init_ifpage(uint sysout_size)

{
  IOPAGE *pIVar1;
  IFPAGE *pIVar2;
  DLword *pDVar3;
  __uid_t __uid;
  long lVar4;
  passwd *ppVar5;
  size_t sVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  pIVar2 = InterfacePage;
  InterfacePage->machinetype = 3;
  pIVar2->dl24bitaddressable = -(ushort)(sysout_size != 8);
  uVar7 = sysout_size * 0x800 - 1;
  if ((Storage_expanded == 0) && (pIVar2->dllastvmempage != uVar7)) {
    init_ifpage_cold_1();
    pIVar1 = IOPage;
    IOPage->dlutilin = 0xffff;
    pIVar1->dlkbdad1 = 0xffff;
    pIVar1->dlkbdad0 = 0xffff;
    pIVar1->dlkbdad3 = 0xffff;
    pIVar1->dlkbdad2 = 0xffff;
    pIVar1->dlkbdad5 = 0xffff;
    pIVar1->dlkbdad4 = 0xffff;
    return;
  }
  pIVar2->dllastvmempage = uVar7;
  *STORAGEFULL_word = 0;
  pIVar2 = InterfacePage;
  InterfacePage->process_size = sysout_size;
  *LASTVMEMFILEPAGE_word = pIVar2->dllastvmempage;
  lVar4 = gethostid();
  pIVar2 = InterfacePage;
  InterfacePage->serialnumber = (DLword)lVar4;
  pIVar2->usernameaddr = 0;
  __uid = getuid();
  ppVar5 = getpwuid(__uid);
  if (ppVar5 != (passwd *)0x0) {
    InterfacePage->usernameaddr = 0xda01;
    pDVar3 = Lisp_world;
    sVar6 = strlen(ppVar5->pw_name);
    iVar8 = 0x3f;
    if ((int)sVar6 < 0x3f) {
      iVar8 = (int)sVar6;
    }
    *(char *)(pDVar3 + 0xda01) = (char)iVar8;
    strncpy((char *)((long)pDVar3 + 0x1b403),ppVar5->pw_name,(long)iVar8);
    iVar9 = iVar8 + 9;
    if (-1 < iVar8 + 6) {
      iVar9 = iVar8 + 6;
    }
    word_swap_page(pDVar3 + 0xda00,iVar9 >> 2);
  }
  pIVar2 = InterfacePage;
  InterfacePage->rversion =
       (short)(SUB164(SEXT816(0x46992343) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) -
       (SUB162(SEXT816(0x46992343) * SEXT816(0x1845c8a0ce512957),0xe) >> 0xf);
  pIVar2->devconfig = pIVar2->devconfig & 0xff87 | (ushort)DisplayType;
  return;
}

Assistant:

void init_ifpage(unsigned sysout_size) {
  extern const time_t MDate;
  extern int DisplayType;
  extern int Storage_expanded;
  unsigned new_lastvmem;
  /*
    Initialize IFPAGE
   */
  InterfacePage->machinetype = MACHINETYPE_MAIKO;
#if defined(MAIKO_ENABLE_ETHERNET) || defined(MAIKO_ENABLE_NETHUB)
  init_ifpage_ether(); /* store ethernet ID in IF page */
#endif /* MAIKO_ENABLE_ETHERNET or MAIKO_ENABLE_NETHUB */
  /*InterfacePage->dl24bitaddressable = (sysout_size == 32? 0xffff : 0);*/
  InterfacePage->dl24bitaddressable = (sysout_size == 8 ? 0 : 0xffff);
  new_lastvmem = (sysout_size * PAGES_IN_MBYTE) - 1;

  if ((!Storage_expanded) && (InterfacePage->dllastvmempage != new_lastvmem)) {
    (void)fprintf(stderr, "You can't expand VMEM\n");
    exit(-1);
  } else { /* Set value which will be set to \\LASTVMEMFILEPAGE in LISP */
    InterfacePage->dllastvmempage = new_lastvmem;
    /* Also you can expand lisp space even if \\STOAGEFULL was T */
    *STORAGEFULL_word = NIL;
  }
  /* Set current process size */
  InterfacePage->process_size = sysout_size;

#ifdef BIGVM
  /* For BIGVM system, save the value in \LASTVMEMFILEPAGE for lisp's use */
  *LASTVMEMFILEPAGE_word = InterfacePage->dllastvmempage;
#endif /* BIGVM */

  /* unfortunately, Lisp only looks at a 16 bit serial number */
#if !defined(DOS) && !defined(MAIKO_OS_HAIKU)
  InterfacePage->serialnumber = 0xffff & gethostid();
#endif /* DOS MAIKO_OS_HAIKU */

/* get user name and stuff into vmem; this is the VMEM buffer;
This is a BCPL string -- it starts with a length count. C strings
are null terminated instead */
  InterfacePage->usernameaddr = 0;
#ifndef DOS
  {
    struct passwd *pwd;
    char *s;
    int len;
    /* Get username from getpwuid */
    /* The page/offset we are using is hardcoded in LLFAULT in functions */
    /*  \MAIKO.NEWFAULTINIT and \MAIKO.ASSIGNBUFFERS */
    if ((pwd = getpwuid(getuid())) != NULL) {
      InterfacePage->usernameaddr = 0155001;
      s = (char *)NativeAligned2FromLAddr(InterfacePage->usernameaddr);
      len = (int)strlen(pwd->pw_name);
      /* Lisp reserves 32 words for the BCPL String */
      len = (len < 32 * BYTESPER_DLWORD) ? len : 32 * BYTESPER_DLWORD - 1;
      *s = (char)len;
      strncpy(s + 1, pwd->pw_name, len);
#ifdef BYTESWAP
      /* we must swap the area we have written into, starting at 0155000 */
      /* rounding up to 4-byte words					 */
      word_swap_page(NativeAligned2FromLAddr(0155000), (len + 1 + 2 + 3) / 4);
#endif
    }

  }
#endif /* DOS */

  /* Days from Oct-13-87 12:00  It's Takeshi's birthday. */
  /* MDate may be set by vdate.c, generated by mkvdate.c. */
  InterfacePage->rversion = (MDate - 561150000) / (60 * 60 * 24);

  /* For DisplayType ,I couldn't insert this line into init_display */
  InterfacePage->devconfig &= 0xff87;
  InterfacePage->devconfig |= DisplayType;
}